

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,binary_expression *e)

{
  token_type tt;
  long *plVar1;
  expression *peVar2;
  int iVar3;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  wchar_t *pwVar6;
  wostream *pwVar7;
  wchar_t local_2c;
  wchar_t local_28;
  wchar_t local_24;
  
  iVar3 = operator_precedence(e->op_);
  print_with_parentheses
            (this,(e->lhs_)._M_t.
                  super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t
                  .super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,iVar3);
  tt = e->op_;
  pwVar7 = this->os_;
  if (tt == dot) {
    plVar1 = *(long **)(pwVar7 + *(long *)(*(long *)pwVar7 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      local_24 = (**(code **)(*plVar1 + 0x50))(plVar1,0x2e);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar7,&local_24,1);
      iVar3 = (**(code **)((long)(((e->rhs_)._M_t.
                                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                   .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl)->
                                 super_syntax_node)._vptr_syntax_node + 0x18))();
      if ((iVar3 != 2) ||
         (peVar2 = (e->rhs_)._M_t.
                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                   super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,
         *(int *)&peVar2[1].super_syntax_node._vptr_syntax_node != 4)) {
        accept<mjs::print_visitor>
                  ((e->rhs_)._M_t.
                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                   super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
        return;
      }
      pwVar7 = this->os_;
      pwVar6 = *(wchar_t **)
                &peVar2[1].super_syntax_node.extend_.file.
                 super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&peVar2[1].super_syntax_node.extend_ + 8))->_M_pi;
LAB_00129f20:
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar7,pwVar6,(long)p_Var5);
      return;
    }
  }
  else {
    if (tt != lbracket) {
      pcVar4 = op_text(tt);
      std::operator<<(pwVar7,pcVar4);
      print_with_parentheses
                (this,(e->rhs_)._M_t.
                      super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                      .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,iVar3);
      return;
    }
    plVar1 = *(long **)(pwVar7 + *(long *)(*(long *)pwVar7 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      local_2c = (**(code **)(*plVar1 + 0x50))(plVar1,0x5b);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar7,&local_2c,1);
      accept<mjs::print_visitor>
                ((e->rhs_)._M_t.
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
      pwVar7 = this->os_;
      plVar1 = *(long **)(pwVar7 + *(long *)(*(long *)pwVar7 + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        local_28 = (**(code **)(*plVar1 + 0x50))(plVar1,0x5d);
        pwVar6 = &local_28;
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        goto LAB_00129f20;
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const binary_expression& e) {
        const int precedence = operator_precedence(e.op());
        print_with_parentheses(e.lhs(), precedence);
        if (e.op() == token_type::lbracket) {
            os_ << '[';
            accept(e.rhs(), *this);
            os_ << ']';
        } else if (e.op() == token_type::dot) {
            os_ << '.';
            if (e.rhs().type() == expression_type::literal) {
                if (const auto& t = static_cast<const literal_expression&>(e.rhs()).t(); t.type() == token_type::string_literal) {
                    os_ << t.text();
                    return;
                }
            }
            accept(e.rhs(), *this);
        } else {
            os_ << op_text(e.op());
            print_with_parentheses(e.rhs(), precedence);
        }
    }